

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::TypeofElem(Var instance,Var index,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  IndexType IVar5;
  int iVar6;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  undefined1 local_70 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  PropertyRecord *debugPropertyRecord;
  Var index_local;
  RecyclableObject *object;
  Var member;
  PropertyRecord *pPStack_38;
  uint32 indexVal;
  PropertyRecord *propertyRecord;
  
  index_local = (Var)0x0;
  debugPropertyRecord = (PropertyRecord *)index;
  BVar4 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&index_local);
  if (BVar4 == 0) {
    pJVar8 = GetPropertyDisplayNameForError(index,scriptContext);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,pJVar8);
  }
  object = (RecyclableObject *)0x0;
  pPStack_38 = (PropertyRecord *)0x0;
  this = scriptContext->threadContext;
  IVar1 = this->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this);
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_70,scriptContext,true);
  IVar5 = GetIndexType(&debugPropertyRecord,scriptContext,(uint32 *)((long)&member + 4),
                       &stack0xffffffffffffffc8,false);
  if (IVar5 == IndexType_PropertyId) {
LAB_00996039:
    if (pPStack_38 == (PropertyRecord *)0x0) {
      bVar3 = CanShortcutOnUnknownPropertyName((RecyclableObject *)index_local);
      if (!bVar3) {
        IVar5 = GetIndexTypeFromPrimitive
                          (debugPropertyRecord,scriptContext,(uint32 *)((long)&member + 4),
                           &stack0xffffffffffffffc8,true);
        if (IVar5 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1e8,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar3) goto LAB_00996268;
          *puVar7 = 0;
        }
        if (pPStack_38 != (PropertyRecord *)0x0) goto LAB_0099612c;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1e9,"(propertyRecord != nullptr)","propertyRecord != nullptr"
                                   );
        if (!bVar3) goto LAB_00996268;
        *puVar7 = 0;
      }
      if (pPStack_38 == (PropertyRecord *)0x0) {
        pJVar8 = JavascriptConversion::ToString(debugPropertyRecord,scriptContext);
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,pJVar8,(PropertyRecord **)&autoCatchHandlerExists.m_threadContext);
        BVar4 = GetProperty(instance,(RecyclableObject *)index_local,
                            ((autoCatchHandlerExists.m_threadContext)->
                            super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
                            _isScriptContextCloseGCPending,&object,scriptContext,
                            (PropertyValueInfo *)0x0);
        if (BVar4 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1fc,
                                      "(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext))"
                                      ,
                                      "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                     );
          if (!bVar3) {
LAB_00996268:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
        this->implicitCallFlags = this->implicitCallFlags | IVar1;
        pJVar8 = StringCache::GetUndefinedDisplay
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             stringCache);
        goto LAB_00996183;
      }
    }
LAB_0099612c:
    iVar6 = GetProperty(instance,(RecyclableObject *)index_local,pPStack_38->pid,&object,
                        scriptContext,(PropertyValueInfo *)0x0);
  }
  else {
    if (IVar5 != IndexType_Number) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1e4,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar3) goto LAB_00996268;
      *puVar7 = 0;
      goto LAB_00996039;
    }
    iVar6 = GetItem(instance,(RecyclableObject *)index_local,member._4_4_,&object,scriptContext);
  }
  if (iVar6 == 0) {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
    this->implicitCallFlags = this->implicitCallFlags | IVar1;
    pJVar8 = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
    this->implicitCallFlags = this->implicitCallFlags | IVar1;
    pJVar8 = (JavascriptString *)Typeof(object,scriptContext);
  }
LAB_00996183:
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_70);
  return pJVar8;
}

Assistant:

Var JavascriptOperators::TypeofElem(Var instance, Var index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem);
        RecyclableObject* object = nullptr;

        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        Var member = nullptr;
        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;

        ThreadContext* threadContext = scriptContext->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        try
        {
            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
            IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

            // For JS Objects, don't create the propertyId if not already added
            if (indexType == IndexType_Number)
            {
                // In edge mode, we don't need to worry about the special "unknown" behavior. If the item is not available from Get,
                // just return undefined.
                if (!JavascriptOperators::GetItem(instance, object, indexVal, &member, scriptContext))
                {
                    // If the instance doesn't have the item, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            else
            {
                Assert(indexType == IndexType_PropertyId);
                if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
                {
                    indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                    Assert(indexType == IndexType_PropertyId);
                    Assert(propertyRecord != nullptr);
                }

                if (propertyRecord != nullptr)
                {
                    if (!JavascriptOperators::GetProperty(instance, object, propertyRecord->GetPropertyId(), &member, scriptContext))
                    {
                        // If the instance doesn't have the property, typeof result is "undefined".
                        threadContext->CheckAndResetImplicitCallAccessorFlag();
                        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                        return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                    }
                }
                else
                {
#if DBG
                    JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                    PropertyRecord const * debugPropertyRecord;
                    scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                    AssertMsg(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                    // If the instance doesn't have the property, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return JavascriptOperators::Typeof(member, scriptContext);
        }
        catch(const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        JIT_HELPER_END(Op_TypeofElem);
    }